

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXParser.cpp
# Opt level: O1

int64_t Assimp::FBX::ParseTokenAsInt64(Token *t,char **err_out)

{
  char cVar1;
  uint *max_inout;
  uint64_t uVar2;
  uint64_t uVar3;
  char *pcVar4;
  uint length;
  char *out;
  int local_2c;
  char *local_28;
  
  *err_out = (char *)0x0;
  if (t->type == TokenType_DATA) {
    if (t->column == 0xffffffff) {
      if (*t->sbegin == 'L') {
        return *(int64_t *)(t->sbegin + 1);
      }
      pcVar4 = "failed to parse Int64, unexpected data type";
    }
    else {
      max_inout = (uint *)t->sbegin;
      local_2c = *(int *)&t->send - (int)max_inout;
      local_28 = (char *)0x0;
      cVar1 = (char)*max_inout;
      uVar2 = strtoul10_64((Assimp *)((ulong)(cVar1 == '+' || cVar1 == '-') + (long)max_inout),
                           (char *)&local_28,(char **)&local_2c,max_inout);
      uVar3 = -uVar2;
      if (cVar1 != '-') {
        uVar3 = uVar2;
      }
      if (local_28 <= t->send) {
        return uVar3;
      }
      pcVar4 = "failed to parse Int64 (text)";
    }
  }
  else {
    pcVar4 = "expected TOK_DATA token";
  }
  *err_out = pcVar4;
  return 0;
}

Assistant:

int64_t ParseTokenAsInt64(const Token& t, const char*& err_out)
{
    err_out = NULL;

    if (t.Type() != TokenType_DATA) {
        err_out = "expected TOK_DATA token";
        return 0L;
    }

    if (t.IsBinary())
    {
        const char* data = t.begin();
        if (data[0] != 'L') {
            err_out = "failed to parse Int64, unexpected data type";
            return 0L;
        }

        BE_NCONST int64_t id = SafeParse<int64_t>(data + 1, t.end());
        AI_SWAP8(id);
        return id;
    }

    // XXX: should use size_t here
    unsigned int length = static_cast<unsigned int>(t.end() - t.begin());
    ai_assert(length > 0);

    const char* out = nullptr;
    const int64_t id = strtol10_64(t.begin(), &out, &length);
    if (out > t.end()) {
        err_out = "failed to parse Int64 (text)";
        return 0L;
    }

    return id;
}